

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void cleanAndroidFiles(Options *options)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar2;
  QLatin1StringView QVar3;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
  *in_stack_ffffffffffffff18;
  char16_t *in_stack_ffffffffffffff20;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *a;
  QString *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff58 [16];
  undefined1 local_80 [24];
  QDir local_68 [8];
  QDir local_60 [8];
  QString *local_58;
  char16_t local_50;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x116fb2);
  if (!bVar1) {
    QDir::QDir(local_60,(QString *)&in_RDI[0x10].d.ptr);
    cleanTopFolders(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_,in_RDI);
    QDir::~QDir(local_60);
  }
  QVar2 = operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  local_58 = QVar2.a;
  local_50 = QVar2.b;
  a = local_48;
  operator+(&a->a,(QString *)in_stack_ffffffffffffff18);
  QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)in_stack_ffffffffffffff28,(size_t)a);
  operator+(a,(QLatin1String *)in_stack_ffffffffffffff18);
  QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff18);
  QDir::QDir(local_68,(QString *)local_80);
  cleanTopFolders((Options *)QVar3.m_data,(QDir *)QVar3.m_size,in_RDI);
  QDir::~QDir(local_68);
  QString::~QString((QString *)0x117101);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cleanAndroidFiles(const Options &options)
{
    if (!options.androidSourceDirectory.isEmpty())
        cleanTopFolders(options, QDir(options.androidSourceDirectory), options.outputDirectory);

    cleanTopFolders(options,
                    QDir(options.qtInstallDirectory + u'/' +
                         options.qtDataDirectory + "/src/android/templates"_L1),
                    options.outputDirectory);
}